

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QObject *o)

{
  int *piVar1;
  _func_int **pp_Var2;
  Stream *pSVar3;
  QDebug *pQVar4;
  long in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebugStateSaver local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_28,(QDebug *)o);
  if (in_RDX == 0) {
    pQVar4 = QDebug::operator<<((QDebug *)o,"QObject(0x0)");
    pSVar3 = pQVar4->stream;
    ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar3;
    piVar1 = &pSVar3->ref;
    *piVar1 = *piVar1 + 1;
  }
  else {
    (**(code **)(**(long **)(in_RDX + 8) + 0x18))(*(long **)(in_RDX + 8),o);
    pp_Var2 = o->_vptr_QObject;
    o->_vptr_QObject = (_func_int **)0x0;
    ((dbg.stream)->ts)._vptr_QTextStream = pp_Var2;
  }
  QDebugStateSaver::~QDebugStateSaver(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QObject *o)
{
    QDebugStateSaver saver(dbg);
    if (!o)
        return dbg << "QObject(0x0)";

    const QObjectPrivate *d = QObjectPrivate::get(o);
    d->writeToDebugStream(dbg);
    return dbg;
}